

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs_wrapper.hpp
# Opt level: O0

int __thiscall AVSInterface::AVSInDelegator::NameToIndex(AVSInDelegator *this,char *name)

{
  int iVar1;
  bool bVar2;
  undefined8 *puVar3;
  mapped_type *pmVar4;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_60;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_58 [3];
  allocator<char> local_39;
  undefined1 local_38 [8];
  string name_string;
  char *name_local;
  AVSInDelegator *this_local;
  
  name_string.field_2._8_8_ = name;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,name,&local_39);
  std::allocator<char>::~allocator(&local_39);
  local_58[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::find(&this->_params_index_map,(key_type *)local_38);
  local_60._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::end(&this->_params_index_map);
  bVar2 = std::__detail::operator==(local_58,&local_60);
  if (!bVar2) {
    pmVar4 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&this->_params_index_map,(key_type *)local_38);
    iVar1 = *pmVar4;
    std::__cxx11::string::~string((string *)local_38);
    return iVar1;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = "Unknown parameter during NameToIndex";
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

int NameToIndex(const char* name) {
      std::string name_string(name);
      if (_params_index_map.find(name_string) == _params_index_map.end())
        throw "Unknown parameter during NameToIndex";
      return _params_index_map[name_string];
    }